

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

processed_entries * anon_unknown.dwarf_2b41b::filter_entries(extract_options *o,info *info)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  pointer ppVar5;
  TypesafeBoolean p_Var6;
  ulong uVar7;
  value_type *pvVar8;
  runtime_error *this;
  reference pvVar9;
  vector<setup::data_entry,_std::allocator<setup::data_entry>_> *this_00;
  file_entry *pfVar10;
  reference pvVar11;
  string *psVar12;
  long in_RDX;
  long in_RSI;
  processed_entries *in_RDI;
  undefined1 auVar13 [16];
  pair<boost::unordered::iterator_detail::iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>,_bool>
  pVar14;
  string *clobberedpath_1;
  string *clobberedpath;
  file_entry *clobberedfile;
  bool newlang;
  bool oldlang;
  char *skip;
  data_entry *olddata;
  data_entry *newdata;
  processed_file *existing_1;
  pair<boost::unordered::iterator_detail::iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>,_bool>
  insertion;
  bool path_included_1;
  string internal_path_1;
  string path_1;
  file_entry *file;
  bool _foreach_continue799;
  auto_any_t _foreach_end799;
  auto_any_t _foreach_cur799;
  auto_any_t _foreach_col799;
  pair<boost::container::vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>,_bool>
  existing;
  iterator it;
  bool path_included;
  string internal_path;
  string path;
  directory_entry *directory;
  bool _foreach_continue758;
  auto_any_t _foreach_end758;
  auto_any_t _foreach_cur758;
  auto_any_t _foreach_col758;
  path_filter includes;
  CollisionMap collisions;
  processed_entries *processed;
  file_entry *in_stack_fffffffffffff9c8;
  shell_command in_stack_fffffffffffff9d0;
  checksum *in_stack_fffffffffffff9d8;
  processed_entries *in_stack_fffffffffffff9e0;
  file_entry *in_stack_fffffffffffff9e8;
  value_type *in_stack_fffffffffffff9f0;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  file *in_stack_fffffffffffffa18;
  file *pfVar15;
  file_entry *in_stack_fffffffffffffa30;
  file_entry *in_stack_fffffffffffffa38;
  data_entry *in_stack_fffffffffffffa40;
  file_entry *in_stack_fffffffffffffa48;
  string *in_stack_fffffffffffffa60;
  filename_map *in_stack_fffffffffffffa68;
  checksum *in_stack_fffffffffffffab0;
  file_entry *in_stack_fffffffffffffab8;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>
  in_stack_fffffffffffffaf0;
  processed_entries *in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  byte local_4b2;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  path_filter *in_stack_fffffffffffffba0;
  _Base_bitset<1UL> in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  directory_entry *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc4;
  undefined1 in_stack_fffffffffffffbc5;
  byte in_stack_fffffffffffffbc6;
  undefined1 in_stack_fffffffffffffbc7;
  __normal_iterator<const_setup::directory_entry_*,_std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>_>
  in_stack_fffffffffffffbc8;
  checksum *local_398;
  string local_350 [32];
  processed_item<setup::file_entry> *local_330;
  node_pointer local_328;
  undefined1 local_320;
  node_pointer local_2a8;
  byte local_2a0;
  byte local_291;
  locale local_290 [8];
  string local_288 [32];
  string local_268 [32];
  string local_248;
  Type local_228;
  file_entry *local_220;
  bool local_211;
  __normal_iterator<const_setup::file_entry_*,_std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>_>
  local_210;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_208;
  __normal_iterator<const_setup::file_entry_*,_std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>_>
  local_200;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1f0;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_1e8;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
  local_1e0 [20];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
  local_140;
  byte local_131;
  locale local_130 [8];
  string local_128 [36];
  undefined4 local_104;
  string local_100 [32];
  string local_e0 [32];
  _WordT local_c0;
  directory_entry *local_b8;
  bool local_a9;
  __normal_iterator<const_setup::directory_entry_*,_std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>_>
  local_a8;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_a0;
  __normal_iterator<const_setup::directory_entry_*,_std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>_>
  local_98;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_80;
  byte local_19;
  long local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  processed_entries::processed_entries(in_stack_fffffffffffff9e0);
  std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>::size
            ((vector<setup::file_entry,_std::allocator<setup::file_entry>_> *)(local_18 + 0x718));
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>
  ::reserve((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>
             *)in_stack_fffffffffffff9d0.command,(size_type)in_stack_fffffffffffff9c8);
  std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>::size
            ((vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *)
             (local_18 + 0x700));
  sVar4 = std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>::size
                    ((vector<setup::file_entry,_std::allocator<setup::file_entry>_> *)
                     (local_18 + 0x718));
  auVar13._8_4_ = (int)(sVar4 >> 0x20);
  auVar13._0_8_ = sVar4;
  auVar13._12_4_ = 0x45300000;
  log((auVar13._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::reserve((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
             *)in_stack_fffffffffffff9d0.command,(size_type)in_stack_fffffffffffff9c8);
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
                   *)in_stack_fffffffffffff9f0);
  path_filter::path_filter
            (in_stack_fffffffffffffba0,
             (extract_options *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  local_88 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             boost::foreach_detail_::contain<std::__cxx11::string_const>
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffff9d8,(false_ *)in_stack_fffffffffffff9d0.command);
  local_80 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)&local_88;
  bVar2 = boost::iostreams::detail::
          indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
          ::can_write(local_80);
  if (!bVar2) {
    local_98._M_current =
         (directory_entry *)
         boost::foreach_detail_::
         begin<std::vector<setup::directory_entry,std::allocator<setup::directory_entry>>,mpl_::bool_<true>>
                   ((auto_any_t)in_stack_fffffffffffff9d8,
                    (type2type<std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>,_mpl_::bool_<true>_>
                     *)in_stack_fffffffffffff9d0.command,(false_ *)in_stack_fffffffffffff9c8);
    local_90 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)&local_98;
    bVar2 = boost::iostreams::detail::
            indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
            ::can_write(local_90);
    if (!bVar2) {
      in_stack_fffffffffffffbc8._M_current =
           (directory_entry *)
           boost::foreach_detail_::
           end<std::vector<setup::directory_entry,std::allocator<setup::directory_entry>>,mpl_::bool_<true>>
                     ((auto_any_t)in_stack_fffffffffffff9d8,
                      (type2type<std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>,_mpl_::bool_<true>_>
                       *)in_stack_fffffffffffff9d0.command,(false_ *)in_stack_fffffffffffff9c8);
      local_a0 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                  *)&local_a8;
      local_a8._M_current = in_stack_fffffffffffffbc8._M_current;
      in_stack_fffffffffffffbc7 =
           boost::iostreams::detail::
           indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
           ::can_write(local_a0);
      if (!(bool)in_stack_fffffffffffffbc7) {
        local_a9 = true;
        while( true ) {
          in_stack_fffffffffffffbc6 = 0;
          if ((local_a9 & 1U) != 0) {
            in_stack_fffffffffffffbc5 =
                 boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                           ((auto_any_t)in_stack_fffffffffffff9e0,
                            (auto_any_t)in_stack_fffffffffffff9d8,
                            (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                             *)in_stack_fffffffffffff9d0.command);
            in_stack_fffffffffffffbc6 = in_stack_fffffffffffffbc5 ^ 0xff;
          }
          if ((in_stack_fffffffffffffbc6 & 1) == 0) break;
          in_stack_fffffffffffffbc4 = boost::foreach_detail_::set_false(&local_a9);
          if (!(bool)in_stack_fffffffffffffbc4) {
            in_stack_fffffffffffffbb8 =
                 (directory_entry *)
                 boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                           ((auto_any_t)in_stack_fffffffffffff9d0.command,
                            (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                             *)in_stack_fffffffffffff9c8);
            local_b8 = in_stack_fffffffffffffbb8;
            while (((local_a9 ^ 0xffU) & 1) != 0) {
              in_stack_fffffffffffffbb7 = false;
              if ((*(byte *)(local_10 + 0x12) & 1) == 0) {
                in_stack_fffffffffffffba8._M_w =
                     (_WordT)flags<setup::directory_entry::flags_Enum_,_5UL>::operator&
                                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)
                                        in_stack_fffffffffffff9d8,
                                        (enum_type)
                                        ((ulong)in_stack_fffffffffffff9d0.command >> 0x20));
                local_c0 = in_stack_fffffffffffffba8._M_w;
                p_Var6 = ::flags::operator_cast_to_function_pointer
                                   ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x121c75);
                in_stack_fffffffffffffbb7 = p_Var6 != (TypesafeBoolean)0x0;
              }
              if ((bool)in_stack_fffffffffffffbb7 == false) {
                uVar7 = std::__cxx11::string::empty();
                if ((uVar7 & 1) == 0) {
                  uVar7 = std::__cxx11::string::empty();
                  if (((uVar7 & 1) != 0) ||
                     (bVar2 = setup::expression_match
                                        ((string *)in_stack_fffffffffffffbb8,
                                         (string *)
                                         CONCAT17(in_stack_fffffffffffffbb7,
                                                  in_stack_fffffffffffffbb0)), bVar2)) {
LAB_00121d20:
                    std::__cxx11::string::string(local_100,(string *)&local_b8->name);
                    setup::filename_map::convert
                              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
                    std::__cxx11::string::~string(local_100);
                    uVar7 = std::__cxx11::string::empty();
                    if ((uVar7 & 1) == 0) {
                      std::locale::locale(local_130);
                      boost::algorithm::to_lower_copy<std::__cxx11::string>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff9e8,(locale *)in_stack_fffffffffffff9e0);
                      std::locale::~locale(local_130);
                      local_131 = path_filter::match((path_filter *)in_stack_fffffffffffffab8,
                                                     (string *)in_stack_fffffffffffffab0);
                      insert_dirs((DirectoriesMap *)in_stack_fffffffffffffbc8._M_current,
                                  (path_filter *)
                                  CONCAT17(in_stack_fffffffffffffbc7,
                                           CONCAT16(in_stack_fffffffffffffbc6,
                                                    CONCAT15(in_stack_fffffffffffffbc5,
                                                             CONCAT14(in_stack_fffffffffffffbc4,
                                                                      in_stack_fffffffffffffbc0)))),
                                  (string *)in_stack_fffffffffffffbb8,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                                  SUB81(in_stack_fffffffffffffba8._M_w >> 0x38,0));
                      boost::container::
                      vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                      ::vec_iterator(&local_140);
                      if ((local_131 & 1) == 0) {
                        boost::container::
                        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        ::find((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                                *)in_stack_fffffffffffff9e8,(key_type *)in_stack_fffffffffffff9e0);
                        boost::container::
                        vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                        ::operator=((vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                                     *)in_stack_fffffffffffff9d0.command,
                                    (vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                                     *)in_stack_fffffffffffff9c8);
                        boost::container::
                        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                               *)in_stack_fffffffffffff9d8);
                        bVar2 = boost::container::operator==(&local_140,local_1e0);
                        if (!bVar2) goto LAB_00122029;
                        local_104 = 7;
                      }
                      else {
                        processed_directory::processed_directory
                                  ((processed_directory *)in_stack_fffffffffffff9d0.command,
                                   (string *)in_stack_fffffffffffff9c8);
                        std::
                        make_pair<std::__cxx11::string&,(anonymous_namespace)::processed_directory>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff9d8,
                                   (processed_directory *)in_stack_fffffffffffff9d0.command);
                        boost::container::
                        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                        ::insert(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>
                        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>
                                 *)in_stack_fffffffffffff9d0.command);
                        processed_directory::~processed_directory((processed_directory *)0x121f0c);
                        boost::container::
                        vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                        ::operator=((vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                                     *)in_stack_fffffffffffff9d0.command,
                                    (vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                                     *)in_stack_fffffffffffff9c8);
LAB_00122029:
                        ppVar5 = boost::container::
                                 vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_directory>_*,_false>
                                 ::operator->(&local_140);
                        processed_item<setup::directory_entry>::set_entry
                                  (&(ppVar5->second).super_processed_item<setup::directory_entry>,
                                   local_b8);
                        local_104 = 0;
                      }
                      std::__cxx11::string::~string(local_128);
                    }
                    else {
                      local_104 = 7;
                    }
                    std::__cxx11::string::~string(local_e0);
                  }
                }
                else if ((*(byte *)(local_10 + 0x13) & 1) == 0) goto LAB_00121d20;
              }
              local_a9 = true;
            }
          }
          if ((local_a9 & 1U) != 0) {
            boost::foreach_detail_::
            next<std::vector<setup::directory_entry,std::allocator<setup::directory_entry>>,mpl_::bool_<true>>
                      ((auto_any_t)in_stack_fffffffffffff9d0.command,
                       (type2type<std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>,_mpl_::bool_<true>_>
                        *)in_stack_fffffffffffff9c8);
          }
        }
      }
    }
  }
  local_1f0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              boost::foreach_detail_::contain<std::__cxx11::string_const>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff9d8,(false_ *)in_stack_fffffffffffff9d0.command);
  local_1e8 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
               *)&local_1f0;
  bVar2 = boost::iostreams::detail::
          indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
          ::can_write(local_1e8);
  if (!bVar2) {
    local_200._M_current =
         (file_entry *)
         boost::foreach_detail_::
         begin<std::vector<setup::file_entry,std::allocator<setup::file_entry>>,mpl_::bool_<true>>
                   ((auto_any_t)in_stack_fffffffffffff9d8,
                    (type2type<std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>,_mpl_::bool_<true>_>
                     *)in_stack_fffffffffffff9d0.command,in_stack_fffffffffffff9c8);
    local_1f8 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                 *)&local_200;
    bVar2 = boost::iostreams::detail::
            indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
            ::can_write(local_1f8);
    if (!bVar2) {
      local_210._M_current =
           (file_entry *)
           boost::foreach_detail_::
           end<std::vector<setup::file_entry,std::allocator<setup::file_entry>>,mpl_::bool_<true>>
                     ((auto_any_t)in_stack_fffffffffffff9d8,
                      (type2type<std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>,_mpl_::bool_<true>_>
                       *)in_stack_fffffffffffff9d0.command,in_stack_fffffffffffff9c8);
      local_208 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                   *)&local_210;
      bVar2 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(local_208);
      if (!bVar2) {
        local_211 = true;
        while( true ) {
          local_4b2 = 0;
          if ((local_211 & 1U) != 0) {
            bVar2 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                              ((auto_any_t)in_stack_fffffffffffff9e0,
                               (auto_any_t)in_stack_fffffffffffff9d8,
                               (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                *)in_stack_fffffffffffff9d0.command);
            local_4b2 = bVar2 ^ 0xff;
          }
          if ((local_4b2 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false(&local_211);
          if (!bVar2) {
            local_220 = (file_entry *)
                        boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                                  ((auto_any_t)in_stack_fffffffffffff9d0.command,
                                   (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                    *)in_stack_fffffffffffff9c8);
            while (((local_211 ^ 0xffU) & 1) != 0) {
              uVar1 = local_220->location;
              sVar4 = std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::size
                                ((vector<setup::data_entry,_std::allocator<setup::data_entry>_> *)
                                 (local_18 + 0x6b8));
              if (uVar1 < sVar4) {
                bVar2 = false;
                if ((*(byte *)(local_10 + 0x12) & 1) == 0) {
                  local_228.super__Base_bitset<1UL>._M_w =
                       (_Base_bitset<1UL>)
                       flags<setup::file_entry::flags_Enum_,_33UL>::operator&
                                 ((flags<setup::file_entry::flags_Enum_,_33UL> *)
                                  in_stack_fffffffffffff9d8,
                                  (enum_type)((ulong)in_stack_fffffffffffff9d0.command >> 0x20));
                  p_Var6 = ::flags::operator_cast_to_function_pointer
                                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x12236c);
                  bVar2 = p_Var6 != (TypesafeBoolean)0x0;
                }
                if (!bVar2) {
                  uVar7 = std::__cxx11::string::empty();
                  if ((uVar7 & 1) == 0) {
                    uVar7 = std::__cxx11::string::empty();
                    if (((uVar7 & 1) != 0) ||
                       (bVar2 = setup::expression_match
                                          ((string *)in_stack_fffffffffffffbb8,
                                           (string *)
                                           CONCAT17(in_stack_fffffffffffffbb7,
                                                    in_stack_fffffffffffffbb0)), bVar2)) {
LAB_00122417:
                      std::__cxx11::string::string(local_268,(string *)&local_220->destination);
                      setup::filename_map::convert
                                (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
                      std::__cxx11::string::~string(local_268);
                      uVar7 = std::__cxx11::string::empty();
                      if ((uVar7 & 1) == 0) {
                        std::locale::locale(local_290);
                        boost::algorithm::to_lower_copy<std::__cxx11::string>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff9e8,(locale *)in_stack_fffffffffffff9e0)
                        ;
                        std::locale::~locale(local_290);
                        in_stack_fffffffffffffb07 =
                             path_filter::match((path_filter *)in_stack_fffffffffffffab8,
                                                (string *)in_stack_fffffffffffffab0);
                        local_291 = in_stack_fffffffffffffb07;
                        insert_dirs((DirectoriesMap *)in_stack_fffffffffffffbc8._M_current,
                                    (path_filter *)
                                    CONCAT17(in_stack_fffffffffffffbc7,
                                             CONCAT16(in_stack_fffffffffffffbc6,
                                                      CONCAT15(in_stack_fffffffffffffbc5,
                                                               CONCAT14(in_stack_fffffffffffffbc4,
                                                                        in_stack_fffffffffffffbc0)))
                                            ),(string *)in_stack_fffffffffffffbb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                                    SUB81(in_stack_fffffffffffffba8._M_w >> 0x38,0));
                        if ((local_291 & 1) == 0) {
                          local_104 = 0xd;
                        }
                        else {
                          in_stack_fffffffffffffaf8 = in_RDI;
                          processed_file::processed_file
                                    ((processed_file *)in_stack_fffffffffffff9d0.command,
                                     in_stack_fffffffffffff9c8,(string *)0x1225eb);
                          std::
                          make_pair<std::__cxx11::string&,(anonymous_namespace)::processed_file>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff9d8,
                                     (processed_file *)in_stack_fffffffffffff9d0.command);
                          pVar14 = boost::unordered::
                                   unordered_map<std::__cxx11::string,(anonymous_namespace)::processed_file,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::processed_file>>>
                                   ::
                                   insert<std::pair<std::__cxx11::string,(anonymous_namespace)::processed_file>>
                                             ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>
                                               *)in_stack_fffffffffffff9f0,
                                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>
                                               *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0
                                             );
                          in_stack_fffffffffffffaf0 = pVar14.first.node_;
                          local_320 = pVar14.second;
                          local_328 = in_stack_fffffffffffffaf0.node_;
                          local_2a8 = in_stack_fffffffffffffaf0.node_;
                          local_2a0 = local_320;
                          std::
                          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>
                          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>
                                   *)in_stack_fffffffffffff9d0.command);
                          processed_file::~processed_file((processed_file *)0x12268c);
                          if ((local_2a0 & 1) == 0) {
                            pvVar8 = boost::unordered::iterator_detail::
                                     iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>
                                     ::operator->((
                                                  iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::processed_file>_>_>
                                                  *)0x1226a7);
                            local_330 = &(pvVar8->second).super_processed_item<setup::file_entry>;
                            if (*(int *)(local_10 + 0x90) == 3) {
                              this = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::operator+((char *)in_stack_fffffffffffffa18,
                                             in_stack_fffffffffffffa10);
                              std::runtime_error::runtime_error(this,local_350);
                              __cxa_throw(this,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            if (*(int *)(local_10 + 0x90) == 2) {
                              boost::unordered::
                              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
                              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
                                            *)in_stack_fffffffffffff9f0,
                                           (key_type *)in_stack_fffffffffffff9e8);
                              processed_file::processed_file
                                        ((processed_file *)in_stack_fffffffffffff9d0.command,
                                         in_stack_fffffffffffff9c8,(string *)0x122840);
                              std::
                              vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>
                              ::push_back((vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>
                                           *)in_stack_fffffffffffff9d0.command,
                                          (value_type *)in_stack_fffffffffffff9c8);
                              processed_file::~processed_file((processed_file *)0x122866);
                            }
                            else {
                              pvVar9 = std::
                                       vector<setup::data_entry,_std::allocator<setup::data_entry>_>
                                       ::operator[]((
                                                  vector<setup::data_entry,_std::allocator<setup::data_entry>_>
                                                  *)(local_18 + 0x6b8),(ulong)local_220->location);
                              this_00 = (vector<setup::data_entry,_std::allocator<setup::data_entry>_>
                                         *)(local_18 + 0x6b8);
                              pfVar10 = processed_item<setup::file_entry>::entry(local_330);
                              pvVar11 = std::
                                        vector<setup::data_entry,_std::allocator<setup::data_entry>_>
                                        ::operator[](this_00,(ulong)pfVar10->location);
                              in_stack_fffffffffffffab8 =
                                   processed_item<setup::file_entry>::entry(local_330);
                              local_398 = (checksum *)
                                          handle_collision(in_stack_fffffffffffffa48,
                                                           in_stack_fffffffffffffa40,
                                                           in_stack_fffffffffffffa38,
                                                           (data_entry *)in_stack_fffffffffffffa30);
                              in_stack_fffffffffffffab0 = local_398;
                              uVar7 = std::__cxx11::string::empty();
                              if ((uVar7 & 1) == 0) {
                                bVar2 = setup::expression_match
                                                  ((string *)in_stack_fffffffffffffbb8,
                                                   (string *)
                                                   CONCAT17(in_stack_fffffffffffffbb7,
                                                            in_stack_fffffffffffffbb0));
                                processed_item<setup::file_entry>::entry(local_330);
                                bVar3 = setup::expression_match
                                                  ((string *)in_stack_fffffffffffffbb8,
                                                   (string *)
                                                   CONCAT17(in_stack_fffffffffffffbb7,
                                                            in_stack_fffffffffffffbb0));
                                if ((!bVar2) || (bVar3)) {
                                  if ((!bVar2) && (bVar3)) {
                                    local_398 = (checksum *)0x1c63b6;
                                  }
                                }
                                else {
                                  local_398 = (checksum *)0x0;
                                }
                              }
                              if (*(int *)(local_10 + 0x90) == 1) {
                                if (local_398 == (checksum *)0x0) {
                                  processed_item<setup::file_entry>::entry(local_330);
                                  (anonymous_namespace)::processed_item<setup::file_entry>::
                                  path_abi_cxx11_((processed_item<setup::file_entry> *)local_330);
                                }
                                in_stack_fffffffffffffa68 =
                                     (filename_map *)
                                     boost::unordered::
                                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
                                     ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
                                                  *)in_stack_fffffffffffff9f0,
                                                  (key_type *)in_stack_fffffffffffff9e8);
                                processed_file::processed_file
                                          ((processed_file *)in_stack_fffffffffffff9d0.command,
                                           in_stack_fffffffffffff9c8,(string *)0x122b5f);
                                std::
                                vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>
                                ::push_back((vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>
                                             *)in_stack_fffffffffffff9d0.command,
                                            (value_type *)in_stack_fffffffffffff9c8);
                                processed_file::~processed_file((processed_file *)0x122b85);
                              }
                              else if ((*(byte *)(local_10 + 1) & 1) == 0) {
                                std::operator<<((ostream *)&std::cout," - ");
                                if (local_398 == (checksum *)0x0) {
                                  psVar12 = (anonymous_namespace)::processed_item<setup::file_entry>
                                            ::path_abi_cxx11_((processed_item<setup::file_entry> *)
                                                              local_330);
                                }
                                else {
                                  psVar12 = &local_248;
                                }
                                in_stack_fffffffffffffa60 = psVar12;
                                std::operator<<((ostream *)&std::cout,'\"');
                                in_stack_fffffffffffffa48 =
                                     (file_entry *)
                                     color::operator<<((ostream *)in_stack_fffffffffffff9c8,
                                                       in_stack_fffffffffffff9d0);
                                in_stack_fffffffffffffa40 =
                                     (data_entry *)
                                     std::operator<<((ostream *)in_stack_fffffffffffffa48,
                                                     (string *)psVar12);
                                in_stack_fffffffffffffa38 =
                                     (file_entry *)
                                     color::operator<<((ostream *)in_stack_fffffffffffff9c8,
                                                       in_stack_fffffffffffff9d0);
                                std::operator<<((ostream *)in_stack_fffffffffffffa38,'\"');
                                in_stack_fffffffffffffa30 = local_220;
                                if (local_398 == (checksum *)0x0) {
                                  in_stack_fffffffffffffa30 =
                                       processed_item<setup::file_entry>::entry(local_330);
                                }
                                print_filter_info((file_entry *)in_stack_fffffffffffff9d0.command);
                                if ((*(byte *)(local_10 + 3) & 1) != 0) {
                                  if (local_398 != (checksum *)0x0) {
                                    pvVar11 = pvVar9;
                                  }
                                  in_stack_fffffffffffffa18 = &pvVar11->file;
                                  pfVar15 = in_stack_fffffffffffffa18;
                                  if (local_398 == (checksum *)0x0) {
                                    pfVar10 = processed_item<setup::file_entry>::entry(local_330);
                                    in_stack_fffffffffffffa10 =
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pfVar10->size;
                                  }
                                  else {
                                    in_stack_fffffffffffffa10 =
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_220->size;
                                  }
                                  print_size_info(pfVar15,(uint64_t)in_stack_fffffffffffffa18);
                                }
                                if ((*(byte *)(local_10 + 4) & 1) != 0) {
                                  std::operator<<((ostream *)&std::cout,' ');
                                  pfVar10 = local_220;
                                  if (local_398 == (checksum *)0x0) {
                                    in_stack_fffffffffffff9e8 =
                                         processed_item<setup::file_entry>::entry(local_330);
                                    pfVar10 = in_stack_fffffffffffff9e8;
                                  }
                                  in_stack_fffffffffffff9f0 = (value_type *)&pfVar10->checksum;
                                  print_checksum_info((file *)in_stack_fffffffffffff9e0,
                                                      in_stack_fffffffffffff9d8);
                                }
                                in_stack_fffffffffffff9e0 =
                                     (processed_entries *)
                                     std::operator<<((ostream *)&std::cout," - ");
                                in_stack_fffffffffffff9d8 = local_398;
                                if (local_398 == (checksum *)0x0) {
                                  in_stack_fffffffffffff9d8 = (checksum *)"overwritten";
                                }
                                in_stack_fffffffffffff9d0.command =
                                     (char *)std::operator<<((ostream *)in_stack_fffffffffffff9e0,
                                                             (char *)in_stack_fffffffffffff9d8);
                                std::operator<<((ostream *)in_stack_fffffffffffff9d0.command,'\n');
                              }
                              if ((local_398 == (checksum *)0x0) &&
                                 (processed_item<setup::file_entry>::set_entry(local_330,local_220),
                                 local_220->type != UninstExe)) {
                                processed_item<setup::file_entry>::set_path
                                          ((processed_item<setup::file_entry> *)
                                           in_stack_fffffffffffff9d0.command,
                                           (string *)in_stack_fffffffffffff9c8);
                              }
                            }
                          }
                          local_104 = 0;
                        }
                        std::__cxx11::string::~string(local_288);
                      }
                      else {
                        local_104 = 0xd;
                      }
                      std::__cxx11::string::~string((string *)&local_248);
                    }
                  }
                  else if ((*(byte *)(local_10 + 0x13) & 1) == 0) goto LAB_00122417;
                }
              }
              local_211 = true;
            }
          }
          if ((local_211 & 1U) != 0) {
            boost::foreach_detail_::
            next<std::vector<setup::file_entry,std::allocator<setup::file_entry>>,mpl_::bool_<false>>
                      ((auto_any_t)in_stack_fffffffffffff9d0.command,
                       (type2type<std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>,_mpl_::bool_<true>_>
                        *)in_stack_fffffffffffff9c8);
          }
        }
      }
    }
  }
  if ((*(int *)(local_10 + 0x90) == 1) || (*(int *)(local_10 + 0x90) == 2)) {
    rename_collisions((extract_options *)
                      CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                      &in_stack_fffffffffffffaf8->files,
                      (CollisionMap *)in_stack_fffffffffffffaf0.node_);
  }
  local_19 = 1;
  local_104 = 1;
  path_filter::~path_filter((path_filter *)0x123026);
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<(anonymous_namespace)::processed_file,_std::allocator<(anonymous_namespace)::processed_file>_>_>_>_>
                    *)0x123033);
  if ((local_19 & 1) == 0) {
    processed_entries::~processed_entries((processed_entries *)in_stack_fffffffffffff9d0.command);
  }
  return in_RDI;
}

Assistant:

processed_entries filter_entries(const extract_options & o, const setup::info & info) {
	
	processed_entries processed;
	
	#if BOOST_VERSION >= 105000
	processed.files.reserve(info.files.size());
	#endif
	
	#if BOOST_VERSION >= 104800
	processed.directories.reserve(info.directories.size()
	                              + size_t(std::log(double(info.files.size()))));
	#endif
	
	CollisionMap collisions;
	
	path_filter includes(o);
	
	// Filter the directories to be created
	BOOST_FOREACH(const setup::directory_entry & directory, info.directories) {
		
		if(!o.extract_temp && (directory.options & setup::directory_entry::DeleteAfterInstall)) {
			continue; // Ignore temporary dirs
		}
		
		if(!directory.languages.empty()) {
			if(!o.language.empty() && !setup::expression_match(o.language, directory.languages)) {
				continue; // Ignore other languages
			}
		} else if(o.language_only) {
			continue; // Ignore language-agnostic dirs
		}
		
		std::string path = o.filenames.convert(directory.name);
		if(path.empty()) {
			continue; // Don't know what to do with this
		}
		std::string internal_path = boost::algorithm::to_lower_copy(path);
		
		bool path_included = includes.match(internal_path);
		
		insert_dirs(processed.directories, includes, internal_path, path, path_included);
		
		DirectoriesMap::iterator it;
		if(path_included) {
			std::pair<DirectoriesMap::iterator, bool> existing = processed.directories.insert(
				std::make_pair(internal_path, processed_directory(path))
			);
			it = existing.first;
		} else {
			it = processed.directories.find(internal_path);
			if(it == processed.directories.end()) {
				continue;
			}
		}
		
		it->second.set_entry(&directory);
	}
	
	// Filter the files to be extracted
	BOOST_FOREACH(const setup::file_entry & file, info.files) {
		
		if(file.location >= info.data_entries.size()) {
			continue; // Ignore external files (copy commands)
		}
		
		if(!o.extract_temp && (file.options & setup::file_entry::DeleteAfterInstall)) {
			continue; // Ignore temporary files
		}
		
		if(!file.languages.empty()) {
			if(!o.language.empty() && !setup::expression_match(o.language, file.languages)) {
				continue; // Ignore other languages
			}
		} else if(o.language_only) {
			continue; // Ignore language-agnostic files
		}
		
		std::string path = o.filenames.convert(file.destination);
		if(path.empty()) {
			continue; // Internal file, not extracted
		}
		std::string internal_path = boost::algorithm::to_lower_copy(path);
		
		bool path_included = includes.match(internal_path);
		
		insert_dirs(processed.directories, includes, internal_path, path, path_included);
		
		if(!path_included) {
			continue; // Ignore excluded file
		}
		
		std::pair<FilesMap::iterator, bool> insertion = processed.files.insert(std::make_pair(
			internal_path, processed_file(&file, path)
		));
		
		if(!insertion.second) {
			// Collision!
			processed_file & existing = insertion.first->second;
			
			if(o.collisions == ErrorOnCollisions) {
				throw std::runtime_error("Collision: " + path);
			} else if(o.collisions == RenameAllCollisions) {
				collisions[internal_path].push_back(processed_file(&file, path));
			} else {
				
				const setup::data_entry & newdata = info.data_entries[file.location];
				const setup::data_entry & olddata = info.data_entries[existing.entry().location];
				const char * skip = handle_collision(existing.entry(), olddata, file, newdata);
				
				if(!o.default_language.empty()) {
					bool oldlang = setup::expression_match(o.default_language, file.languages);
					bool newlang = setup::expression_match(o.default_language, existing.entry().languages);
					if(oldlang && !newlang) {
						skip = NULL;
					} else if(!oldlang && newlang) {
						skip = "overwritten";
					}
				}
				
				if(o.collisions == RenameCollisions) {
					const setup::file_entry & clobberedfile = skip ? file : existing.entry();
					const std::string & clobberedpath = skip ? path : existing.path();
					collisions[internal_path].push_back(processed_file(&clobberedfile, clobberedpath));
				} else if(!o.silent) {
					std::cout << " - ";
					const std::string & clobberedpath = skip ? path : existing.path();
					std::cout << '"' << color::dim_yellow << clobberedpath << color::reset << '"';
					print_filter_info(skip ? file : existing.entry());
					if(o.list_sizes) {
						print_size_info(skip ? newdata.file : olddata.file, skip ? file.size : existing.entry().size);
					}
					if(o.list_checksums) {
						std::cout << ' ';
						print_checksum_info(skip ? newdata.file : olddata.file,
						                    skip ? &file.checksum : &existing.entry().checksum);
					}
					std::cout << " - " << (skip ? skip : "overwritten") << '\n';
				}
				
				if(!skip) {
					existing.set_entry(&file);
					if(file.type != setup::file_entry::UninstExe) {
						// Old file is "deleted" first → use case from new file
						existing.set_path(path);
					}
				}
				
			}
			
		}
		
	}
	
	if(o.collisions == RenameCollisions || o.collisions == RenameAllCollisions) {
		rename_collisions(o, processed.files, collisions);
	}
	
	return processed;
}